

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_mutex.cpp
# Opt level: O0

void __thiscall SharedMutex::~SharedMutex(SharedMutex *this)

{
  __pid_t _Var1;
  int iVar2;
  pointer this_00;
  pthread_mutex_t *__mutex;
  ContextManager *pCVar3;
  string local_30;
  SharedMutex *local_10;
  SharedMutex *this_local;
  
  local_10 = this;
  _Var1 = getpid();
  if (_Var1 == this->owner_pid_) {
    this_00 = std::
              unique_ptr<SharedMemoryObject<pthread_mutex_t>,_std::default_delete<SharedMemoryObject<pthread_mutex_t>_>_>
              ::operator->(&this->mutex_);
    __mutex = SharedMemoryObject<pthread_mutex_t>::get(this_00);
    iVar2 = pthread_mutex_destroy((pthread_mutex_t *)__mutex);
    if (iVar2 != 0) {
      pCVar3 = ContextManager::get();
      format_abi_cxx11_(&local_30,"Failed to destroy mutex: %m");
      (**pCVar3->_vptr_ContextManager)(pCVar3,&local_30);
      std::__cxx11::string::~string((string *)&local_30);
    }
  }
  std::
  unique_ptr<SharedMemoryObject<pthread_mutex_t>,_std::default_delete<SharedMemoryObject<pthread_mutex_t>_>_>
  ::~unique_ptr(&this->mutex_);
  return;
}

Assistant:

SharedMutex::~SharedMutex() {
    if (getpid() == owner_pid_) {
        if (pthread_mutex_destroy(mutex_->get()) != 0) {
            die(format("Failed to destroy mutex: %m"));
        }
    }
}